

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.c
# Opt level: O0

int str_utf8_check(char *str)

{
  char *str_local;
  
  str_local = str;
  while( true ) {
    while( true ) {
      while( true ) {
        while( true ) {
          if (*str_local == '\0') {
            return 1;
          }
          if (((int)*str_local & 0x80U) != 0) break;
          str_local = str_local + 1;
        }
        if ((((int)*str_local & 0xe0U) != 0xc0) || (((int)str_local[1] & 0xc0U) != 0x80)) break;
        str_local = str_local + 2;
      }
      if ((((int)*str_local & 0xf0U) != 0xe0) ||
         ((((int)str_local[1] & 0xc0U) != 0x80 || (((int)str_local[2] & 0xc0U) != 0x80)))) break;
      str_local = str_local + 3;
    }
    if ((((int)*str_local & 0xf8U) != 0xf0) ||
       (((((int)str_local[1] & 0xc0U) != 0x80 || (((int)str_local[2] & 0xc0U) != 0x80)) ||
        (((int)str_local[3] & 0xc0U) != 0x80)))) break;
    str_local = str_local + 4;
  }
  return 0;
}

Assistant:

int str_utf8_check(const char *str)
{
	while(*str)
	{
		if((*str&0x80) == 0x0)
			str++;
		else if((*str&0xE0) == 0xC0 && (*(str+1)&0xC0) == 0x80)
			str += 2;
		else if((*str&0xF0) == 0xE0 && (*(str+1)&0xC0) == 0x80 && (*(str+2)&0xC0) == 0x80)
			str += 3;
		else if((*str&0xF8) == 0xF0 && (*(str+1)&0xC0) == 0x80 && (*(str+2)&0xC0) == 0x80 && (*(str+3)&0xC0) == 0x80)
			str += 4;
		else
			return 0;
	}
	return 1;
}